

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O0

void chan_generaterhythm2(opl_chip *chip)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  Bit16u phasebit;
  Bit16u phase;
  Bit16u phase17;
  Bit16u phase14;
  opl_channel *channel8;
  opl_channel *channel7;
  opl_channel *channel6;
  opl_chip *chip_local;
  
  slot_generate(chip->channel[6].slots[1]);
  uVar3 = chip->channel[7].slots[0]->pg_phase >> 9;
  uVar1 = (ushort)uVar3 & 0x3ff;
  uVar2 = (ushort)(chip->channel[8].slots[1]->pg_phase >> 9) & 0x3ff;
  slot_generatephase(chip->channel[7].slots[1],
                     (ushort)(0x100 << ((byte)(uVar1 >> 8) & 1)) ^ (ushort)((chip->noise & 1) << 8))
  ;
  slot_generatephase(chip->channel[8].slots[1],
                     (ushort)(((uVar3 & 8) != 0 || (((int)(uint)uVar1 >> 5 ^ (uint)uVar1) & 4) != 0)
                             || (((int)(uint)uVar2 >> 2 ^ (uint)uVar2) & 8) != 0) << 9 | 0x100);
  return;
}

Assistant:

void chan_generaterhythm2(opl_chip *chip) {
	opl_channel *channel6 = &chip->channel[6];
	opl_channel *channel7 = &chip->channel[7];
	opl_channel *channel8 = &chip->channel[8];
	slot_generate(channel6->slots[1]);
	Bit16u phase14 = (channel7->slots[0]->pg_phase >> 9) & 0x3ff;
	Bit16u phase17 = (channel8->slots[1]->pg_phase >> 9) & 0x3ff;
	Bit16u phase = 0x00;
	//hh tc phase bit
	Bit16u phasebit = ((phase14 & 0x08) | (((phase14 >> 5) ^ phase14) & 0x04) | (((phase17 >> 2) ^ phase17) & 0x08)) ? 0x01 : 0x00;
	//sd
	phase = (0x100 << ((phase14 >> 8) & 0x01)) ^ ((chip->noise & 0x01) << 8);
	slot_generatephase(channel7->slots[1], phase);
	//tc
	phase = 0x100 | (phasebit << 9);
	slot_generatephase(channel8->slots[1], phase);
}